

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

__m128i convolve8_8_odd_offset_ssse3(__m128i *s,__m128i *f)

{
  longlong in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  __m128i temp;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i k_64;
  
  auVar1 = pmaddubsw(*in_RDI,*in_RSI);
  auVar2 = pmaddubsw(in_RDI[1],in_RSI[1]);
  auVar3 = pmaddubsw(in_RDI[2],in_RSI[2]);
  auVar4 = pmaddubsw(in_RDI[3],in_RSI[3]);
  auVar5 = pmaddubsw(in_RDI[4],in_RSI[4]);
  auVar6._8_8_ = 0x4040404040404040;
  auVar6._0_8_ = 0x4040404040404040;
  auVar6 = pmaddubsw(in_RDI[2],auVar6);
  auVar1 = paddsw(auVar1,auVar2);
  auVar1 = paddsw(auVar1,auVar3);
  auVar1 = paddsw(auVar1,auVar4);
  auVar1 = paddsw(auVar1,auVar5);
  auVar6 = paddsw(auVar1,auVar6);
  auVar1._8_8_ = 0x40004000400040;
  auVar1._0_8_ = 0x40004000400040;
  auVar6 = paddsw(auVar6,auVar1);
  psraw(auVar6,ZEXT416(7));
  alVar7[1] = in_RDX;
  alVar7[0] = 7;
  return alVar7;
}

Assistant:

static inline __m128i convolve8_8_odd_offset_ssse3(const __m128i *const s,
                                                   const __m128i *const f) {
  // multiply 2 adjacent elements with the filter and add the result
  const __m128i k_64 = _mm_set1_epi16(1 << 6);
  const __m128i x0 = _mm_maddubs_epi16(s[0], f[0]);
  const __m128i x1 = _mm_maddubs_epi16(s[1], f[1]);
  const __m128i x2 = _mm_maddubs_epi16(s[2], f[2]);
  const __m128i x3 = _mm_maddubs_epi16(s[3], f[3]);
  const __m128i x4 = _mm_maddubs_epi16(s[4], f[4]);
  // compensate the subtracted 64 in f[2]. x5 is always non negative.
  const __m128i x5 = _mm_maddubs_epi16(s[2], _mm_set1_epi8(64));
  __m128i temp;

  // add and saturate the results together
  temp = _mm_adds_epi16(x0, x1);
  temp = _mm_adds_epi16(temp, x2);
  temp = _mm_adds_epi16(temp, x3);
  temp = _mm_adds_epi16(temp, x4);
  temp = _mm_adds_epi16(temp, x5);
  // round and shift by 7 bit each 16 bit
  temp = _mm_adds_epi16(temp, k_64);
  temp = _mm_srai_epi16(temp, 7);
  return temp;
}